

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2FilterHandlers.cpp
# Opt level: O2

int __thiscall AttrList::getIndex(AttrList *this,XMLCh *qName)

{
  bool bVar1;
  Attr *pAVar2;
  XMLSize_t i;
  ulong getAt;
  
  getAt = 0;
  while( true ) {
    if ((this->super_RefVectorOf<Attr>).super_BaseRefVectorOf<Attr>.fCurCount <= getAt) {
      return -1;
    }
    pAVar2 = xercesc_4_0::BaseRefVectorOf<Attr>::elementAt
                       (&(this->super_RefVectorOf<Attr>).super_BaseRefVectorOf<Attr>,getAt);
    bVar1 = xercesc_4_0::XMLString::equals(pAVar2->qName,qName);
    if (bVar1) break;
    getAt = getAt + 1;
  }
  return (int)getAt;
}

Assistant:

virtual int getIndex(const XMLCh* const qName ) const
    {
        for(XMLSize_t i=0;i<size();i++)
            if(XMLString::equals(elementAt(i)->qName,qName))
                return (int)i;
        return -1;
    }